

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O0

void duckdb_zstd::ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp *ws)

{
  ZSTD_cwksp *in_RDI;
  
  if (in_RDI->tableValidEnd < in_RDI->tableEnd) {
    in_RDI->tableValidEnd = in_RDI->tableEnd;
  }
  ZSTD_cwksp_assert_internal_consistency(in_RDI);
  return;
}

Assistant:

MEM_STATIC void ZSTD_cwksp_mark_tables_clean(ZSTD_cwksp* ws) {
    DEBUGLOG(4, "cwksp: ZSTD_cwksp_mark_tables_clean");
    assert(ws->tableValidEnd >= ws->objectEnd);
    assert(ws->tableValidEnd <= ws->allocStart);
    if (ws->tableValidEnd < ws->tableEnd) {
        ws->tableValidEnd = ws->tableEnd;
    }
    ZSTD_cwksp_assert_internal_consistency(ws);
}